

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<std::pair<QString,_QFileInfo>_>::copyAppend
          (QGenericArrayOps<std::pair<QString,_QFileInfo>_> *this,pair<QString,_QFileInfo> *b,
          pair<QString,_QFileInfo> *e)

{
  pair<QString,_QFileInfo> *this_00;
  ulong in_RDX;
  ulong in_RSI;
  pair<QString,_QFileInfo> *in_RDI;
  pair<QString,_QFileInfo> *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<std::pair<QString,_QFileInfo>_>::begin
                        ((QArrayDataPointer<std::pair<QString,_QFileInfo>_> *)0xa9c317);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      std::pair<QString,_QFileInfo>::pair(this_00,in_RDI);
      local_10 = local_10 + 0x20;
      (in_RDI->first).d.size = (in_RDI->first).d.size + 1;
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }